

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VSS.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::VSSMethod::doRNEMDImpl
          (VSSMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  Vector3d *this_00;
  Vector3d *v;
  uint *puVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  Vector3d *pVVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  Vector<double,_3U> *v1;
  Vector<double,_3U> *v1_00;
  Vector<double,_3U> *v1_01;
  ulong uVar8;
  pointer ppSVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double local_430;
  Vector3d *local_428;
  uint local_420;
  uint local_41c;
  StuntDouble *sd;
  Vector3d *local_410;
  Vector3d *local_408;
  double local_400;
  double local_3f8;
  Vector3d *local_3f0;
  Vector3d vel_2;
  int selej;
  int selei;
  Vector3d angMom;
  Vector3d omegah;
  Vector3d rPos_2;
  Vector3d omegac;
  Vector3d bc;
  Mat3x3d I;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> coldBin;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> hotBin;
  Vector3d ac;
  Vector3d vh;
  Vector3d bh;
  Vector<double,_3U> local_240;
  Vector<double,_3U> local_228;
  Vector<double,_3U> local_210;
  Vector3d vc;
  Vector3d ah;
  Vector3d acrec;
  Mat3x3d Ic;
  Mat3x3d Ih;
  Vector3d Lc;
  Vector3d Pc;
  Vector3d Lh;
  Vector3d Ph;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector3d angMom_2;
  Vector3d bhrec;
  Vector3d ahrec;
  Vector3d bcrec;
  
  if ((this->super_RNEMD).doRNEMD_ != true) {
    return;
  }
  hotBin.super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hotBin.super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hotBin.super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coldBin.super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coldBin.super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coldBin.super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Vector<double,_3U>::Vector(&Ph.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  Vector<double,_3U>::Vector(&Lh.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  RectMatrix<double,_3U,_3U>::RectMatrix((RectMatrix<double,_3U,_3U> *)&Ih,0.0);
  Vector<double,_3U>::Vector(&Pc.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  Vector<double,_3U>::Vector(&Lc.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  RectMatrix<double,_3U,_3U>::RectMatrix((RectMatrix<double,_3U,_3U> *)&Ic,0.0);
  uVar6 = (this->super_RNEMD).rnemdFluxType_ - rnemdPx;
  if ((uVar6 < 0x12) && ((0x3f8ffU >> (uVar6 & 0x1f) & 1) != 0)) {
    local_420 = 0x3c0f0 >> ((byte)uVar6 & 0x1f);
    local_41c = 0x3f0f >> ((byte)uVar6 & 0x1f);
  }
  else {
    bVar2 = (this->super_RNEMD).usePeriodicBoundaryConditions_;
    local_41c = (uint)bVar2;
    local_420 = bVar2 ^ 1;
  }
  sd = SelectionManager::beginSelected(smanA,&selei);
  local_3f0 = &(this->super_RNEMD).coordinateOrigin_;
  local_400 = 0.0;
  local_3f8 = 0.0;
  while (sd != (StuntDouble *)0x0) {
    StuntDouble::getPos(&ac,sd);
    if ((this->super_RNEMD).usePeriodicBoundaryConditions_ == true) {
      Snapshot::wrapVector((this->super_RNEMD).currentSnap_,&ac);
    }
    dVar12 = sd->mass_;
    StuntDouble::getVel((Vector3d *)&acrec.super_Vector<double,_3U>,sd);
    StuntDouble::getPos(&angMom,sd);
    operator-((Vector<double,_3U> *)&I,(Vector<double,_3U> *)&angMom,
              &local_3f0->super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&bc.super_Vector<double,_3U>,(Vector<double,_3U> *)&I);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
              (&hotBin,&sd);
    operator*((Vector<double,_3U> *)&I,dVar12,&acrec.super_Vector<double,_3U>);
    Vector<double,_3U>::add(&Ph.super_Vector<double,_3U>,(Vector<double,_3U> *)&I);
    dVar10 = Vector<double,_3U>::lengthSquare(&acrec.super_Vector<double,_3U>);
    cross<double>((Vector3<double> *)&angMom,(Vector3<double> *)&bc.super_Vector<double,_3U>,
                  (Vector3<double> *)&acrec.super_Vector<double,_3U>);
    operator*((Vector<double,_3U> *)&I,dVar12,(Vector<double,_3U> *)&angMom);
    Vector<double,_3U>::add(&Lh.super_Vector<double,_3U>,(Vector<double,_3U> *)&I);
    outProduct<double>((SquareMatrix3<double> *)&angMom,
                       (Vector3<double> *)&bc.super_Vector<double,_3U>,
                       (Vector3<double> *)&bc.super_Vector<double,_3U>);
    operator*((RectMatrix<double,_3U,_3U> *)&I,(RectMatrix<double,_3U,_3U> *)&angMom,dVar12);
    local_428 = (Vector3d *)(dVar10 * dVar12 + local_400);
    RectMatrix<double,_3U,_3U>::sub
              ((RectMatrix<double,_3U,_3U> *)&Ih,(RectMatrix<double,_3U,_3U> *)&I);
    dVar10 = Vector<double,_3U>::lengthSquare(&bc.super_Vector<double,_3U>);
    dVar10 = dVar10 * dVar12;
    Ih.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         Ih.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] + dVar10;
    Ih.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         Ih.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] + dVar10;
    Ih.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         dVar10 + Ih.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
    if (((this->super_RNEMD).rnemdFluxType_ == rnemdFullKE) && (sd->objType_ - otDAtom < 2)) {
      StuntDouble::getJ(&angMom,sd);
      (*sd->_vptr_StuntDouble[5])((RectMatrix<double,_3U,_3U> *)&I);
      if (sd->linear_ == true) {
        uVar8 = (long)(sd->linearAxis_ + 1) % 3 & 0xffffffff;
        uVar7 = (long)(sd->linearAxis_ + 2) % 3 & 0xffffffff;
        dVar10 = angMom.super_Vector<double,_3U>.data_[uVar8];
        dVar11 = (dVar10 * dVar10) /
                 *(double *)
                  ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                  uVar8 * 0x20);
        dVar10 = angMom.super_Vector<double,_3U>.data_[uVar7];
        dVar10 = dVar10 * dVar10;
        pdVar5 = (double *)
                 ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                 uVar7 * 0x20);
      }
      else {
        auVar13._0_8_ =
             angMom.super_Vector<double,_3U>.data_[0] * angMom.super_Vector<double,_3U>.data_[0];
        auVar13._8_8_ =
             angMom.super_Vector<double,_3U>.data_[1] * angMom.super_Vector<double,_3U>.data_[1];
        auVar14._8_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]
        ;
        auVar14._0_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
        ;
        auVar14 = divpd(auVar13,auVar14);
        dVar11 = auVar14._8_8_ + auVar14._0_8_;
        dVar10 = angMom.super_Vector<double,_3U>.data_[2] * angMom.super_Vector<double,_3U>.data_[2]
        ;
        pdVar5 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] + 2;
      }
      local_428 = (Vector3d *)((double)local_428 + dVar10 / *pdVar5 + dVar11);
    }
    local_3f8 = local_3f8 + dVar12;
    sd = SelectionManager::nextSelected(smanA,&selei);
    local_400 = (double)local_428;
  }
  sd = SelectionManager::beginSelected(smanB,&selej);
  local_410 = (Vector3d *)0x0;
  local_408 = (Vector3d *)0x0;
  while (sd != (StuntDouble *)0x0) {
    StuntDouble::getPos(&ac,sd);
    if ((this->super_RNEMD).usePeriodicBoundaryConditions_ == true) {
      Snapshot::wrapVector((this->super_RNEMD).currentSnap_,&ac);
    }
    dVar12 = sd->mass_;
    StuntDouble::getVel((Vector3d *)&acrec.super_Vector<double,_3U>,sd);
    StuntDouble::getPos(&angMom,sd);
    operator-((Vector<double,_3U> *)&I,(Vector<double,_3U> *)&angMom,
              &local_3f0->super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&bc.super_Vector<double,_3U>,(Vector<double,_3U> *)&I);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
              (&coldBin,&sd);
    operator*((Vector<double,_3U> *)&I,dVar12,&acrec.super_Vector<double,_3U>);
    Vector<double,_3U>::add(&Pc.super_Vector<double,_3U>,(Vector<double,_3U> *)&I);
    dVar10 = Vector<double,_3U>::lengthSquare(&acrec.super_Vector<double,_3U>);
    cross<double>((Vector3<double> *)&angMom,(Vector3<double> *)&bc.super_Vector<double,_3U>,
                  (Vector3<double> *)&acrec.super_Vector<double,_3U>);
    operator*((Vector<double,_3U> *)&I,dVar12,(Vector<double,_3U> *)&angMom);
    Vector<double,_3U>::add(&Lc.super_Vector<double,_3U>,(Vector<double,_3U> *)&I);
    outProduct<double>((SquareMatrix3<double> *)&angMom,
                       (Vector3<double> *)&bc.super_Vector<double,_3U>,
                       (Vector3<double> *)&bc.super_Vector<double,_3U>);
    operator*((RectMatrix<double,_3U,_3U> *)&I,(RectMatrix<double,_3U,_3U> *)&angMom,dVar12);
    local_428 = (Vector3d *)(dVar10 * dVar12 + (double)local_410);
    RectMatrix<double,_3U,_3U>::sub
              ((RectMatrix<double,_3U,_3U> *)&Ic,(RectMatrix<double,_3U,_3U> *)&I);
    dVar10 = Vector<double,_3U>::lengthSquare(&bc.super_Vector<double,_3U>);
    dVar10 = dVar10 * dVar12;
    Ic.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         Ic.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] + dVar10;
    Ic.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         Ic.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] + dVar10;
    Ic.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         dVar10 + Ic.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
    if (((this->super_RNEMD).rnemdFluxType_ == rnemdFullKE) && (sd->objType_ - otDAtom < 2)) {
      StuntDouble::getJ(&angMom,sd);
      (*sd->_vptr_StuntDouble[5])((RectMatrix<double,_3U,_3U> *)&I);
      if (sd->linear_ == true) {
        uVar8 = (long)(sd->linearAxis_ + 1) % 3 & 0xffffffff;
        uVar7 = (long)(sd->linearAxis_ + 2) % 3 & 0xffffffff;
        dVar10 = angMom.super_Vector<double,_3U>.data_[uVar8];
        dVar11 = (dVar10 * dVar10) /
                 *(double *)
                  ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                  uVar8 * 0x20);
        dVar10 = angMom.super_Vector<double,_3U>.data_[uVar7];
        dVar10 = dVar10 * dVar10;
        pdVar5 = (double *)
                 ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                 uVar7 * 0x20);
      }
      else {
        auVar15._0_8_ =
             angMom.super_Vector<double,_3U>.data_[0] * angMom.super_Vector<double,_3U>.data_[0];
        auVar15._8_8_ =
             angMom.super_Vector<double,_3U>.data_[1] * angMom.super_Vector<double,_3U>.data_[1];
        auVar3._8_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
        auVar3._0_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
        auVar14 = divpd(auVar15,auVar3);
        dVar11 = auVar14._8_8_ + auVar14._0_8_;
        dVar10 = angMom.super_Vector<double,_3U>.data_[2] * angMom.super_Vector<double,_3U>.data_[2]
        ;
        pdVar5 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] + 2;
      }
      local_428 = (Vector3d *)((double)local_428 + dVar10 / *pdVar5 + dVar11);
    }
    local_408 = (Vector3d *)((double)local_408 + dVar12);
    sd = SelectionManager::nextSelected(smanB,&selej);
    local_410 = local_428;
  }
  Vector<double,_3U>::Vector(&ac.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&acrec.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&bc.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&bcrec.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&ah.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&ahrec.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&bh.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&bhrec.super_Vector<double,_3U>);
  if ((0.0 < local_3f8) && (0.0 < (double)local_408)) {
    operator/((Vector<double,_3U> *)&I,&Pc.super_Vector<double,_3U>,(double)local_408);
    Vector<double,_3U>::Vector(&vc.super_Vector<double,_3U>,(Vector<double,_3U> *)&I);
    this_00 = &(this->super_RNEMD).momentumTarget_;
    operator-(&omegac.super_Vector<double,_3U>,(OpenMD *)this_00,v1);
    operator/(&angMom.super_Vector<double,_3U>,&omegac.super_Vector<double,_3U>,(double)local_408);
    OpenMD::operator+((Vector<double,_3U> *)&I,&angMom.super_Vector<double,_3U>,
                      &vc.super_Vector<double,_3U>);
    Vector3<double>::operator=(&ac,(Vector<double,_3U> *)&I);
    operator-(&angMom.super_Vector<double,_3U>,(OpenMD *)this_00,v1_00);
    operator/((Vector<double,_3U> *)&I,&angMom.super_Vector<double,_3U>,(double)local_408);
    Vector3<double>::operator=(&acrec,(Vector<double,_3U> *)&I);
    SquareMatrix3<double>::inverse(&I,&Ic);
    operator*(&angMom.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&I,
              &Lc.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&omegac.super_Vector<double,_3U>,&angMom.super_Vector<double,_3U>);
    v = &(this->super_RNEMD).angularMomentumTarget_;
    operator*(&omegah.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&I,
              &v->super_Vector<double,_3U>);
    operator-(&vh.super_Vector<double,_3U>,(OpenMD *)&omegah,v1_01);
    OpenMD::operator+(&angMom.super_Vector<double,_3U>,&vh.super_Vector<double,_3U>,
                      &omegac.super_Vector<double,_3U>);
    Vector3<double>::operator=(&bc,&angMom.super_Vector<double,_3U>);
    operator-(&angMom.super_Vector<double,_3U>,&bc.super_Vector<double,_3U>,
              &omegac.super_Vector<double,_3U>);
    Vector3<double>::operator=(&bcrec,&angMom.super_Vector<double,_3U>);
    local_410 = (Vector3d *)((double)local_410 * 0.5);
    local_430 = (double)local_410 - (this->super_RNEMD).kineticTarget_;
    if ((local_41c & 1) != 0) {
      dVar12 = Vector<double,_3U>::lengthSquare(&ac.super_Vector<double,_3U>);
      local_430 = local_430 + (double)local_408 * -0.5 * dVar12;
    }
    if ((local_420 & 1) != 0) {
      operator*(&angMom.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&Ic,
                &bc.super_Vector<double,_3U>);
      dVar12 = dot<double,3u>(&bc.super_Vector<double,_3U>,&angMom.super_Vector<double,_3U>);
      local_430 = local_430 + dVar12 * -0.5;
    }
    if ((local_41c & 1) != 0) {
      dVar12 = Vector<double,_3U>::lengthSquare(&vc.super_Vector<double,_3U>);
      local_410 = (Vector3d *)((double)local_410 + (double)local_408 * -0.5 * dVar12);
    }
    pVVar4 = local_410;
    if ((local_420 & 1) != 0) {
      operator*(&angMom.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&Ic,
                &omegac.super_Vector<double,_3U>);
      dVar12 = dot<double,3u>(&omegac.super_Vector<double,_3U>,&angMom.super_Vector<double,_3U>);
      pVVar4 = (Vector3d *)((double)local_410 + dVar12 * -0.5);
    }
    local_430 = local_430 / (double)pVVar4;
    if (0.0 < local_430) {
      if (local_430 < 0.0) {
        local_430 = sqrt(local_430);
      }
      else {
        local_430 = SQRT(local_430);
      }
      if ((0.9 < local_430) && (local_430 < 1.1)) {
        operator/(&angMom.super_Vector<double,_3U>,&Ph.super_Vector<double,_3U>,local_3f8);
        Vector<double,_3U>::Vector(&vh.super_Vector<double,_3U>,&angMom.super_Vector<double,_3U>);
        operator/(&omegah.super_Vector<double,_3U>,&this_00->super_Vector<double,_3U>,local_3f8);
        OpenMD::operator+(&angMom.super_Vector<double,_3U>,&omegah.super_Vector<double,_3U>,
                          &vh.super_Vector<double,_3U>);
        Vector3<double>::operator=(&ah,&angMom.super_Vector<double,_3U>);
        operator/(&angMom.super_Vector<double,_3U>,&this_00->super_Vector<double,_3U>,local_3f8);
        Vector3<double>::operator=(&ahrec,&angMom.super_Vector<double,_3U>);
        SquareMatrix3<double>::inverse((SquareMatrix3<double> *)&angMom,&Ih);
        operator*(&vel_2.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&angMom,
                  &Lh.super_Vector<double,_3U>);
        Vector<double,_3U>::Vector(&omegah.super_Vector<double,_3U>,&vel_2.super_Vector<double,_3U>)
        ;
        operator*(&rPos_2.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&angMom,
                  &v->super_Vector<double,_3U>);
        OpenMD::operator+(&vel_2.super_Vector<double,_3U>,&rPos_2.super_Vector<double,_3U>,
                          &omegah.super_Vector<double,_3U>);
        Vector3<double>::operator=(&bh,&vel_2.super_Vector<double,_3U>);
        operator-(&vel_2.super_Vector<double,_3U>,&bh.super_Vector<double,_3U>,
                  &omegah.super_Vector<double,_3U>);
        Vector3<double>::operator=(&bhrec,&vel_2.super_Vector<double,_3U>);
        local_400 = local_400 * 0.5;
        local_428 = (Vector3d *)((this->super_RNEMD).kineticTarget_ + local_400);
        if ((local_41c & 1) != 0) {
          dVar12 = Vector<double,_3U>::lengthSquare(&ah.super_Vector<double,_3U>);
          local_428 = (Vector3d *)((double)local_428 + local_3f8 * -0.5 * dVar12);
        }
        if ((local_420 & 1) != 0) {
          operator*(&vel_2.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&Ih,
                    &bh.super_Vector<double,_3U>);
          dVar12 = dot<double,3u>(&bh.super_Vector<double,_3U>,&vel_2.super_Vector<double,_3U>);
          local_428 = (Vector3d *)((double)local_428 + dVar12 * -0.5);
        }
        if ((local_41c & 1) != 0) {
          dVar12 = Vector<double,_3U>::lengthSquare(&vh.super_Vector<double,_3U>);
          local_400 = local_400 + local_3f8 * -0.5 * dVar12;
        }
        dVar12 = local_400;
        if ((local_420 & 1) != 0) {
          operator*(&vel_2.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&Ih,
                    &omegah.super_Vector<double,_3U>);
          dVar12 = dot<double,3u>(&omegah.super_Vector<double,_3U>,&vel_2.super_Vector<double,_3U>);
          dVar12 = local_400 + dVar12 * -0.5;
        }
        dVar12 = (double)local_428 / dVar12;
        if (0.0 < dVar12) {
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          if ((0.9 < dVar12) && (dVar12 < 1.1)) {
            local_410 = v;
            local_408 = this_00;
            Vector<double,_3U>::Vector(&vel_2.super_Vector<double,_3U>);
            Vector<double,_3U>::Vector(&rPos_2.super_Vector<double,_3U>);
            for (ppSVar9 = coldBin.
                           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppSVar9 !=
                coldBin.
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppSVar9 = ppSVar9 + 1) {
              if ((local_41c & 1) != 0) {
                StuntDouble::getVel((Vector3d *)&local_240,*ppSVar9);
                operator-(&local_c0,&local_240,&vc.super_Vector<double,_3U>);
                operator*(&local_a8,&local_c0,local_430);
                OpenMD::operator+(&angMom_2.super_Vector<double,_3U>,&local_a8,
                                  &ac.super_Vector<double,_3U>);
                Vector3<double>::operator=(&vel_2,&angMom_2.super_Vector<double,_3U>);
              }
              if ((local_420 & 1) != 0) {
                StuntDouble::getPos((Vector3d *)&local_a8,*ppSVar9);
                operator-(&angMom_2.super_Vector<double,_3U>,&local_a8,
                          &local_3f0->super_Vector<double,_3U>);
                Vector3<double>::operator=(&rPos_2,&angMom_2.super_Vector<double,_3U>);
                StuntDouble::getVel((Vector3d *)&local_240,*ppSVar9);
                cross<double>((Vector3<double> *)&local_210,&omegac,&rPos_2);
                operator-(&local_c0,&local_240,&local_210);
                operator*(&local_a8,&local_c0,local_430);
                cross<double>((Vector3<double> *)&local_228,&bc,&rPos_2);
                OpenMD::operator+(&angMom_2.super_Vector<double,_3U>,&local_a8,&local_228);
                Vector3<double>::operator=(&vel_2,&angMom_2.super_Vector<double,_3U>);
              }
              StuntDouble::setVel(*ppSVar9,&vel_2);
              if (((this->super_RNEMD).rnemdFluxType_ == rnemdFullKE) &&
                 ((*ppSVar9)->objType_ - otDAtom < 2)) {
                StuntDouble::getJ((Vector3d *)&local_c0,*ppSVar9);
                operator*(&local_a8,&local_c0,local_430);
                Vector<double,_3U>::Vector(&angMom_2.super_Vector<double,_3U>,&local_a8);
                StuntDouble::setJ(*ppSVar9,(Vector3d *)&angMom_2.super_Vector<double,_3U>);
              }
            }
            for (ppSVar9 = hotBin.
                           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppSVar9 !=
                hotBin.
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppSVar9 = ppSVar9 + 1) {
              if ((local_41c & 1) != 0) {
                StuntDouble::getVel((Vector3d *)&local_240,*ppSVar9);
                operator-(&local_c0,&local_240,&vh.super_Vector<double,_3U>);
                operator*(&local_a8,&local_c0,dVar12);
                OpenMD::operator+(&angMom_2.super_Vector<double,_3U>,&local_a8,
                                  &ah.super_Vector<double,_3U>);
                Vector3<double>::operator=(&vel_2,&angMom_2.super_Vector<double,_3U>);
              }
              if ((local_420 & 1) != 0) {
                StuntDouble::getPos((Vector3d *)&local_a8,*ppSVar9);
                operator-(&angMom_2.super_Vector<double,_3U>,&local_a8,
                          &local_3f0->super_Vector<double,_3U>);
                Vector3<double>::operator=(&rPos_2,&angMom_2.super_Vector<double,_3U>);
                StuntDouble::getVel((Vector3d *)&local_240,*ppSVar9);
                cross<double>((Vector3<double> *)&local_210,&omegah,&rPos_2);
                operator-(&local_c0,&local_240,&local_210);
                operator*(&local_a8,&local_c0,dVar12);
                cross<double>((Vector3<double> *)&local_228,&bh,&rPos_2);
                OpenMD::operator+(&angMom_2.super_Vector<double,_3U>,&local_a8,&local_228);
                Vector3<double>::operator=(&vel_2,&angMom_2.super_Vector<double,_3U>);
              }
              StuntDouble::setVel(*ppSVar9,&vel_2);
              if (((this->super_RNEMD).rnemdFluxType_ == rnemdFullKE) &&
                 ((*ppSVar9)->objType_ - otDAtom < 2)) {
                StuntDouble::getJ((Vector3d *)&local_c0,*ppSVar9);
                operator*(&local_a8,&local_c0,dVar12);
                Vector<double,_3U>::Vector(&angMom_2.super_Vector<double,_3U>,&local_a8);
                StuntDouble::setJ(*ppSVar9,(Vector3d *)&angMom_2.super_Vector<double,_3U>);
              }
            }
            (this->super_RNEMD).kineticExchange_ =
                 (this->super_RNEMD).kineticTarget_ + (this->super_RNEMD).kineticExchange_;
            Vector<double,_3U>::add
                      (&(this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>,
                       &local_408->super_Vector<double,_3U>);
            Vector<double,_3U>::add
                      (&(this->super_RNEMD).angularMomentumExchange_.super_Vector<double,_3U>,
                       &local_410->super_Vector<double,_3U>);
            goto LAB_0023400c;
          }
        }
      }
    }
  }
  memcpy(&painCave,
         "VSS exchange NOT performed - roots that solve\n\tthe constraint equations may not exist or there may be\n\tno selected objects in one or both slabs.\n"
         ,0x92);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  puVar1 = &(this->super_RNEMD).failTrialCount_;
  *puVar1 = *puVar1 + 1;
LAB_0023400c:
  std::_Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~_Vector_base
            (&coldBin.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>);
  std::_Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~_Vector_base
            (&hotBin.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>);
  return;
}

Assistant:

void VSSMethod::doRNEMDImpl(SelectionManager& smanA,
                              SelectionManager& smanB) {
    if (!doRNEMD_) return;
    int selei;
    int selej;

    StuntDouble* sd;

    vector<StuntDouble*> hotBin, coldBin;

    Vector3d Ph(V3Zero);
    Vector3d Lh(V3Zero);
    RealType Mh = 0.0;
    Mat3x3d Ih(0.0);
    RealType Kh = 0.0;
    Vector3d Pc(V3Zero);
    Vector3d Lc(V3Zero);
    RealType Mc = 0.0;
    Mat3x3d Ic(0.0);
    RealType Kc = 0.0;

    // Constraints can be on only the linear or angular momentum, but
    // not both.  Usually, the user will specify which they want, but
    // in case they don't, the use of periodic boundaries should make
    // the choice for us.
    bool doLinearPart  = false;
    bool doAngularPart = false;

    switch (rnemdFluxType_) {
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
    case rnemdPvector:
    case rnemdKePx:
    case rnemdKePy:
    case rnemdKePvector:
      doLinearPart = true;
      break;
    case rnemdLx:
    case rnemdLy:
    case rnemdLz:
    case rnemdLvector:
    case rnemdKeLx:
    case rnemdKeLy:
    case rnemdKeLz:
    case rnemdKeLvector:
      doAngularPart = true;
      break;
    case rnemdKE:
    case rnemdRotKE:
    case rnemdFullKE:
    default:
      if (usePeriodicBoundaryConditions_)
        doLinearPart = true;
      else
        doAngularPart = true;
      break;
    }

    for (sd = smanA.beginSelected(selei); sd != NULL;
         sd = smanA.nextSelected(selei)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:
      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      Vector3d rPos = sd->getPos() - coordinateOrigin_;
      RealType r2;

      hotBin.push_back(sd);
      Ph += mass * vel;
      Mh += mass;
      Kh += mass * vel.lengthSquare();
      Lh += mass * cross(rPos, vel);
      Ih -= outProduct(rPos, rPos) * mass;
      r2 = rPos.lengthSquare();
      Ih(0, 0) += mass * r2;
      Ih(1, 1) += mass * r2;
      Ih(2, 2) += mass * r2;

      if (rnemdFluxType_ == rnemdFullKE) {
        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();
          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            Kh += angMom[j] * angMom[j] / I(j, j) +
                  angMom[k] * angMom[k] / I(k, k);
          } else {
            Kh += angMom[0] * angMom[0] / I(0, 0) +
                  angMom[1] * angMom[1] / I(1, 1) +
                  angMom[2] * angMom[2] / I(2, 2);
          }
        }
      }
    }

    for (sd = smanB.beginSelected(selej); sd != NULL;
         sd = smanB.nextSelected(selej)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:
      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      Vector3d rPos = sd->getPos() - coordinateOrigin_;
      RealType r2;

      coldBin.push_back(sd);
      Pc += mass * vel;
      Mc += mass;
      Kc += mass * vel.lengthSquare();
      Lc += mass * cross(rPos, vel);
      Ic -= outProduct(rPos, rPos) * mass;
      r2 = rPos.lengthSquare();
      Ic(0, 0) += mass * r2;
      Ic(1, 1) += mass * r2;
      Ic(2, 2) += mass * r2;

      if (rnemdFluxType_ == rnemdFullKE) {
        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();
          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            Kc += angMom[j] * angMom[j] / I(j, j) +
                  angMom[k] * angMom[k] / I(k, k);
          } else {
            Kc += angMom[0] * angMom[0] / I(0, 0) +
                  angMom[1] * angMom[1] / I(1, 1) +
                  angMom[2] * angMom[2] / I(2, 2);
          }
        }
      }
    }

    Kh *= 0.5;
    Kc *= 0.5;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &Ph[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Pc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Lh[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Lc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Mh, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Kh, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Mc, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Kc, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, Ih.getArrayPointer(), 9, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, Ic.getArrayPointer(), 9, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    Vector3d ac, acrec, bc, bcrec;
    Vector3d ah, ahrec, bh, bhrec;

    bool successfulExchange = false;
    if ((Mh > 0.0) && (Mc > 0.0)) {  // both slabs are not empty

      Vector3d vc = Pc / Mc;
      ac          = -momentumTarget_ / Mc + vc;
      acrec       = -momentumTarget_ / Mc;

      // We now need the inverse of the inertia tensor to calculate the
      // angular velocity of the cold slab;
      Mat3x3d Ici     = Ic.inverse();
      Vector3d omegac = Ici * Lc;
      bc              = -(Ici * angularMomentumTarget_) + omegac;
      bcrec           = bc - omegac;

      RealType cNumerator = Kc - kineticTarget_;
      if (doLinearPart) cNumerator -= 0.5 * Mc * ac.lengthSquare();

      if (doAngularPart) cNumerator -= 0.5 * (dot(bc, Ic * bc));

      RealType cDenominator = Kc;

      if (doLinearPart) cDenominator -= 0.5 * Mc * vc.lengthSquare();

      if (doAngularPart) cDenominator -= 0.5 * (dot(omegac, Ic * omegac));

      if (cNumerator / cDenominator > 0.0) {
        RealType c = sqrt(cNumerator / cDenominator);

        if ((c > 0.9) && (c < 1.1)) {  // restrict scaling coefficients

          Vector3d vh = Ph / Mh;
          ah          = momentumTarget_ / Mh + vh;
          ahrec       = momentumTarget_ / Mh;

          // We now need the inverse of the inertia tensor to
          // calculate the angular velocity of the hot slab;
          Mat3x3d Ihi     = Ih.inverse();
          Vector3d omegah = Ihi * Lh;
          bh              = (Ihi * angularMomentumTarget_) + omegah;
          bhrec           = bh - omegah;

          RealType hNumerator = Kh + kineticTarget_;
          if (doLinearPart) hNumerator -= 0.5 * Mh * ah.lengthSquare();

          if (doAngularPart) hNumerator -= 0.5 * (dot(bh, Ih * bh));

          RealType hDenominator = Kh;
          if (doLinearPart) hDenominator -= 0.5 * Mh * vh.lengthSquare();
          if (doAngularPart) hDenominator -= 0.5 * (dot(omegah, Ih * omegah));

          if (hNumerator / hDenominator > 0.0) {
            RealType h = sqrt(hNumerator / hDenominator);

            if ((h > 0.9) && (h < 1.1)) {
              vector<StuntDouble*>::iterator sdi;
              Vector3d vel;
              Vector3d rPos;

              for (sdi = coldBin.begin(); sdi != coldBin.end(); ++sdi) {
                if (doLinearPart) vel = ((*sdi)->getVel() - vc) * c + ac;
                if (doAngularPart) {
                  rPos = (*sdi)->getPos() - coordinateOrigin_;
                  vel  = ((*sdi)->getVel() - cross(omegac, rPos)) * c +
                        cross(bc, rPos);
                }

                (*sdi)->setVel(vel);

                if (rnemdFluxType_ == rnemdFullKE) {
                  if ((*sdi)->isDirectional()) {
                    Vector3d angMom = (*sdi)->getJ() * c;
                    (*sdi)->setJ(angMom);
                  }
                }
              }

              for (sdi = hotBin.begin(); sdi != hotBin.end(); ++sdi) {
                if (doLinearPart) vel = ((*sdi)->getVel() - vh) * h + ah;
                if (doAngularPart) {
                  rPos = (*sdi)->getPos() - coordinateOrigin_;
                  vel  = ((*sdi)->getVel() - cross(omegah, rPos)) * h +
                        cross(bh, rPos);
                }

                (*sdi)->setVel(vel);

                if (rnemdFluxType_ == rnemdFullKE) {
                  if ((*sdi)->isDirectional()) {
                    Vector3d angMom = (*sdi)->getJ() * h;
                    (*sdi)->setJ(angMom);
                  }
                }
              }

              successfulExchange = true;
              kineticExchange_ += kineticTarget_;
              momentumExchange_ += momentumTarget_;
              angularMomentumExchange_ += angularMomentumTarget_;
            }
          }
        }
      }
    }

    if (successfulExchange != true) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "VSS exchange NOT performed - roots that solve\n"
               "\tthe constraint equations may not exist or there may be\n"
               "\tno selected objects in one or both slabs.\n");
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_INFO;
      simError();
      failTrialCount_++;
    }
  }